

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>::
emplaceValue<QXmlStreamReaderPrivate::Entity>
          (Node<QStringView,_QXmlStreamReaderPrivate::Entity> *this,Entity *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QArrayData *data;
  QArrayData *data_00;
  Data *pDVar4;
  char16_t *pcVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  
  qVar2 = (args->name).d.size;
  (args->name).d.size = 0;
  qVar3 = (args->value).d.size;
  (args->value).d.size = 0;
  uVar1 = args->field_0x30;
  pDVar4 = (args->name).d.d;
  pcVar5 = (args->name).d.ptr;
  (args->name).d.d = (Data *)0x0;
  (args->name).d.ptr = (char16_t *)0x0;
  (this->value).name.d.size = qVar2;
  pDVar6 = (args->value).d.d;
  pcVar7 = (args->value).d.ptr;
  (args->value).d.d = (Data *)0x0;
  (args->value).d.ptr = (char16_t *)0x0;
  data = &((this->value).name.d.d)->super_QArrayData;
  data_00 = &((this->value).value.d.d)->super_QArrayData;
  (this->value).name.d.d = pDVar4;
  (this->value).name.d.ptr = pcVar5;
  (this->value).value.d.d = pDVar6;
  (this->value).value.d.ptr = pcVar7;
  (this->value).value.d.size = qVar3;
  (this->value).field_0x30 = uVar1;
  if (data_00 != (QArrayData *)0x0) {
    LOCK();
    (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
         (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data_00,2,0x10);
    }
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }